

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

int P_Find3DFloor(sector_t *sec,DVector3 *pos,bool above,bool floor,double *cmpz)

{
  F3DFloor **ppFVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  subsector_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if (sec == (sector_t *)0x0) {
    psVar4 = P_PointInSubsector(pos->X,pos->Y);
    sec = psVar4->sector;
  }
  dVar7 = ((sec->ceilingplane).normal.Y * pos->Y +
          (sec->ceilingplane).D + (sec->ceilingplane).normal.X * pos->X) * (sec->ceilingplane).negiC
  ;
  *cmpz = dVar7;
  if ((pos->Z < dVar7) &&
     (dVar7 = ((sec->floorplane).normal.Y * pos->Y +
              (sec->floorplane).D + (sec->floorplane).normal.X * pos->X) * (sec->floorplane).negiC,
     *cmpz = dVar7, dVar7 < pos->Z)) {
    uVar6 = (ulong)(int)(sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (0 < (long)uVar6) {
      ppFVar1 = (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      uVar5 = 0;
      do {
        pFVar2 = ppFVar1[uVar5];
        if ((~pFVar2->flags & 3) == 0) {
          dVar7 = pos->Z;
          if (above) {
            if (floor) {
              psVar3 = (pFVar2->top).plane;
              dVar8 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                      psVar3->negiC;
              *cmpz = dVar8;
              if (dVar7 < dVar8) {
                dVar7 = pos->Z;
                goto LAB_004feac4;
              }
            }
            else {
LAB_004feac4:
              psVar3 = (pFVar2->bottom).plane;
              dVar8 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                      psVar3->negiC;
              *cmpz = dVar8;
              if (dVar7 < dVar8) goto LAB_004feb65;
            }
            uVar5 = (ulong)((int)uVar5 - 1);
LAB_004feb75:
            return (int)uVar5;
          }
          if (!floor) {
            psVar3 = (pFVar2->bottom).plane;
            dVar8 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                    psVar3->negiC;
            *cmpz = dVar8;
            if (dVar7 <= dVar8) goto LAB_004feb75;
            dVar7 = pos->Z;
          }
          psVar3 = (pFVar2->top).plane;
          dVar8 = ((psVar3->normal).Y * pos->Y + psVar3->D + (psVar3->normal).X * pos->X) *
                  psVar3->negiC;
          *cmpz = dVar8;
          if (dVar7 <= dVar8) goto LAB_004feb75;
        }
LAB_004feb65:
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  return -1;
}

Assistant:

int	P_Find3DFloor(sector_t * sec, const DVector3 &pos, bool above, bool floor, double &cmpz)
{
	// If no sector given, find the one appropriate
	if (sec == NULL)
		sec = P_PointInSector(pos);

	// Above normal ceiling
	cmpz = sec->ceilingplane.ZatPoint(pos);
	if (pos.Z >= cmpz)
		return -1;

	// Below normal floor
	cmpz = sec->floorplane.ZatPoint(pos);
	if (pos.Z <= cmpz)
		return -1;

	// Looking through planes from top to bottom
	for (int i = 0; i < (signed)sec->e->XFloor.ffloors.Size(); ++i)
	{
		F3DFloor *rover = sec->e->XFloor.ffloors[i];

		// We are only interested in solid 3D floors here
		if(!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		if (above)
		{
			// z is above that floor
			if (floor && (pos.Z >= (cmpz = rover->top.plane->ZatPoint(pos))))
				return i - 1;
			// z is above that ceiling
			if (pos.Z >= (cmpz = rover->bottom.plane->ZatPoint(pos)))
				return i - 1;
		}
		else // below
		{
			// z is below that ceiling
			if (!floor && (pos.Z <= (cmpz = rover->bottom.plane->ZatPoint(pos))))
				return i;
			// z is below that floor
			if (pos.Z <= (cmpz = rover->top.plane->ZatPoint(pos)))
				return i;
		}
	}

	// Failsafe
	return -1;
}